

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRFunctionPrototype * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::allocate<unsigned_int&>
          (ObjectPool<spirv_cross::SPIRFunctionPrototype> *this,uint *p)

{
  Vector<spirv_cross::SPIRFunctionPrototype_*> *this_00;
  uint uVar1;
  SPIRFunctionPrototype *pSVar2;
  size_t sVar3;
  ulong count;
  bool bVar4;
  SPIRFunctionPrototype *ptr;
  SPIRFunctionPrototype *local_40;
  SPIRFunctionPrototype *local_38;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,_spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar2 = (SPIRFunctionPrototype *)malloc(count * 0x48);
    if (pSVar2 == (SPIRFunctionPrototype *)0x0) {
      return (SPIRFunctionPrototype *)0x0;
    }
    local_38 = pSVar2;
    SmallVector<spirv_cross::SPIRFunctionPrototype_*,_0UL>::reserve(this_00,count);
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      local_40 = pSVar2;
      SmallVector<spirv_cross::SPIRFunctionPrototype_*,_0UL>::push_back(this_00,&local_40);
      pSVar2 = pSVar2 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRFunctionPrototype*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRFunctionPrototype,spirv_cross::ObjectPool<spirv_cross::SPIRFunctionPrototype>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRFunctionPrototype_*>.buffer_size;
  }
  pSVar2 = (this_00->super_VectorView<spirv_cross::SPIRFunctionPrototype_*>).ptr[sVar3 - 1];
  SmallVector<spirv_cross::SPIRFunctionPrototype_*,_0UL>::pop_back(this_00);
  uVar1 = *p;
  (pSVar2->super_IVariant).self.id = 0;
  (pSVar2->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunctionPrototype_003559c8;
  *(uint *)&(pSVar2->super_IVariant).field_0xc = uVar1;
  (pSVar2->parameter_types).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar2->parameter_types).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar2->parameter_types).stack_storage;
  (pSVar2->parameter_types).buffer_capacity = 8;
  return pSVar2;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}